

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressStream2
                 (ZSTD_CCtx *cctx,ZSTD_outBuffer *output,ZSTD_inBuffer *input,
                 ZSTD_EndDirective endOp)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  ulong inSize;
  size_t code;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t totalInputSize;
  size_t inputSize;
  ZSTD_EndDirective endOp_local;
  ZSTD_inBuffer *input_local;
  ZSTD_outBuffer *output_local;
  ZSTD_CCtx *cctx_local;
  
  if (output->size < output->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffba;
  }
  else if (input->size < input->pos) {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffb8;
  }
  else if (endOp < (ZSTD_e_end|ZSTD_e_flush)) {
    if (cctx == (ZSTD_CCtx *)0x0) {
      __assert_fail("cctx != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x1843,
                    "size_t ZSTD_compressStream2(ZSTD_CCtx *, ZSTD_outBuffer *, ZSTD_inBuffer *, ZSTD_EndDirective)"
                   );
    }
    if (cctx->streamStage == zcss_init) {
      lVar3 = input->size - input->pos;
      inSize = lVar3 + cctx->stableIn_notConsumed;
      if ((((cctx->requestedParams).inBufferMode == ZSTD_bm_stable) && (endOp == ZSTD_e_continue))
         && (inSize < 0x20000)) {
        if (cctx->stableIn_notConsumed != 0) {
          if (input->src != (cctx->expectedInBuffer).src) {
            return 0xffffffffffffffce;
          }
          if (input->pos != (cctx->expectedInBuffer).size) {
            return 0xffffffffffffffce;
          }
        }
        input->pos = input->size;
        (cctx->expectedInBuffer).src = input->src;
        (cctx->expectedInBuffer).size = input->size;
        (cctx->expectedInBuffer).pos = input->pos;
        cctx->stableIn_notConsumed = lVar3 + cctx->stableIn_notConsumed;
        iVar1 = 2;
        if ((cctx->requestedParams).format == ZSTD_f_zstd1) {
          iVar1 = 6;
        }
        return (long)iVar1;
      }
      code = ZSTD_CCtx_init_compressStream2(cctx,endOp,inSize);
      uVar2 = ERR_isError(code);
      if (uVar2 != 0) {
        return code;
      }
      ZSTD_setBufferExpectations(cctx,output,input);
    }
    cctx_local = (ZSTD_CCtx *)ZSTD_checkBufferStability(cctx,output,input,endOp);
    uVar2 = ERR_isError((size_t)cctx_local);
    if (uVar2 == 0) {
      cctx_local = (ZSTD_CCtx *)ZSTD_compressStream_generic(cctx,output,input,endOp);
      uVar2 = ERR_isError((size_t)cctx_local);
      if (uVar2 == 0) {
        ZSTD_setBufferExpectations(cctx,output,input);
        cctx_local = (ZSTD_CCtx *)(cctx->outBuffContentSize - cctx->outBuffFlushedSize);
      }
    }
  }
  else {
    cctx_local = (ZSTD_CCtx *)0xffffffffffffffd6;
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressStream2( ZSTD_CCtx* cctx,
                             ZSTD_outBuffer* output,
                             ZSTD_inBuffer* input,
                             ZSTD_EndDirective endOp)
{
    DEBUGLOG(5, "ZSTD_compressStream2, endOp=%u ", (unsigned)endOp);
    /* check conditions */
    RETURN_ERROR_IF(output->pos > output->size, dstSize_tooSmall, "invalid output buffer");
    RETURN_ERROR_IF(input->pos  > input->size, srcSize_wrong, "invalid input buffer");
    RETURN_ERROR_IF((U32)endOp > (U32)ZSTD_e_end, parameter_outOfBound, "invalid endDirective");
    assert(cctx != NULL);

    /* transparent initialization stage */
    if (cctx->streamStage == zcss_init) {
        size_t const inputSize = input->size - input->pos;  /* no obligation to start from pos==0 */
        size_t const totalInputSize = inputSize + cctx->stableIn_notConsumed;
        if ( (cctx->requestedParams.inBufferMode == ZSTD_bm_stable) /* input is presumed stable, across invocations */
          && (endOp == ZSTD_e_continue)                             /* no flush requested, more input to come */
          && (totalInputSize < ZSTD_BLOCKSIZE_MAX) ) {              /* not even reached one block yet */
            if (cctx->stableIn_notConsumed) {  /* not the first time */
                /* check stable source guarantees */
                RETURN_ERROR_IF(input->src != cctx->expectedInBuffer.src, stabilityCondition_notRespected, "stableInBuffer condition not respected: wrong src pointer");
                RETURN_ERROR_IF(input->pos != cctx->expectedInBuffer.size, stabilityCondition_notRespected, "stableInBuffer condition not respected: externally modified pos");
            }
            /* pretend input was consumed, to give a sense forward progress */
            input->pos = input->size;
            /* save stable inBuffer, for later control, and flush/end */
            cctx->expectedInBuffer = *input;
            /* but actually input wasn't consumed, so keep track of position from where compression shall resume */
            cctx->stableIn_notConsumed += inputSize;
            /* don't initialize yet, wait for the first block of flush() order, for better parameters adaptation */
            return ZSTD_FRAMEHEADERSIZE_MIN(cctx->requestedParams.format);  /* at least some header to produce */
        }
        FORWARD_IF_ERROR(ZSTD_CCtx_init_compressStream2(cctx, endOp, totalInputSize), "compressStream2 initialization failed");
        ZSTD_setBufferExpectations(cctx, output, input);   /* Set initial buffer expectations now that we've initialized */
    }
    /* end of transparent initialization stage */

    FORWARD_IF_ERROR(ZSTD_checkBufferStability(cctx, output, input, endOp), "invalid buffers");
    /* compression stage */
#ifdef ZSTD_MULTITHREAD
    if (cctx->appliedParams.nbWorkers > 0) {
        size_t flushMin;
        if (cctx->cParamsChanged) {
            ZSTDMT_updateCParams_whileCompressing(cctx->mtctx, &cctx->requestedParams);
            cctx->cParamsChanged = 0;
        }
        if (cctx->stableIn_notConsumed) {
            assert(cctx->appliedParams.inBufferMode == ZSTD_bm_stable);
            /* some early data was skipped - make it available for consumption */
            assert(input->pos >= cctx->stableIn_notConsumed);
            input->pos -= cctx->stableIn_notConsumed;
            cctx->stableIn_notConsumed = 0;
        }
        for (;;) {
            size_t const ipos = input->pos;
            size_t const opos = output->pos;
            flushMin = ZSTDMT_compressStream_generic(cctx->mtctx, output, input, endOp);
            cctx->consumedSrcSize += (U64)(input->pos - ipos);
            cctx->producedCSize += (U64)(output->pos - opos);
            if ( ZSTD_isError(flushMin)
              || (endOp == ZSTD_e_end && flushMin == 0) ) { /* compression completed */
                if (flushMin == 0)
                    ZSTD_CCtx_trace(cctx, 0);
                ZSTD_CCtx_reset(cctx, ZSTD_reset_session_only);
            }
            FORWARD_IF_ERROR(flushMin, "ZSTDMT_compressStream_generic failed");

            if (endOp == ZSTD_e_continue) {
                /* We only require some progress with ZSTD_e_continue, not maximal progress.
                 * We're done if we've consumed or produced any bytes, or either buffer is
                 * full.
                 */
                if (input->pos != ipos || output->pos != opos || input->pos == input->size || output->pos == output->size)
                    break;
            } else {
                assert(endOp == ZSTD_e_flush || endOp == ZSTD_e_end);
                /* We require maximal progress. We're done when the flush is complete or the
                 * output buffer is full.
                 */
                if (flushMin == 0 || output->pos == output->size)
                    break;
            }
        }
        DEBUGLOG(5, "completed ZSTD_compressStream2 delegating to ZSTDMT_compressStream_generic");
        /* Either we don't require maximum forward progress, we've finished the
         * flush, or we are out of output space.
         */
        assert(endOp == ZSTD_e_continue || flushMin == 0 || output->pos == output->size);
        ZSTD_setBufferExpectations(cctx, output, input);
        return flushMin;
    }
#endif /* ZSTD_MULTITHREAD */
    FORWARD_IF_ERROR( ZSTD_compressStream_generic(cctx, output, input, endOp) , "");
    DEBUGLOG(5, "completed ZSTD_compressStream2");
    ZSTD_setBufferExpectations(cctx, output, input);
    return cctx->outBuffContentSize - cctx->outBuffFlushedSize; /* remaining to flush */
}